

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

string * disassemble_spirv_abi_cxx11_
                   (string *__return_storage_ptr__,VulkanDevice *device,VkPipeline pipeline,
                   DisasmMethod method,VkShaderStageFlagBits stage,
                   VkShaderModuleCreateInfo *module_create_info,char *entry_point)

{
  allocator local_31;
  VkShaderModuleCreateInfo *local_30;
  VkShaderModuleCreateInfo *module_create_info_local;
  VkShaderStageFlagBits stage_local;
  DisasmMethod method_local;
  VkPipeline pipeline_local;
  VulkanDevice *device_local;
  
  local_30 = module_create_info;
  module_create_info_local._0_4_ = stage;
  module_create_info_local._4_4_ = method;
  _stage_local = pipeline;
  pipeline_local = (VkPipeline)device;
  device_local = (VulkanDevice *)__return_storage_ptr__;
  if (method == Asm) {
    disassemble_spirv_asm_abi_cxx11_(__return_storage_ptr__,module_create_info);
  }
  else if (method == GLSL) {
    disassemble_spirv_glsl_abi_cxx11_(__return_storage_ptr__,module_create_info,entry_point,stage);
  }
  else if (method == ISA) {
    disassemble_spirv_isa_abi_cxx11_(__return_storage_ptr__,device,pipeline,stage);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

static string disassemble_spirv(const VulkanDevice &device, VkPipeline pipeline,
                                DisasmMethod method, VkShaderStageFlagBits stage,
                                const VkShaderModuleCreateInfo *module_create_info, const char *entry_point)
{
	switch (method)
	{
	case DisasmMethod::Asm:
		return disassemble_spirv_asm(module_create_info);

	case DisasmMethod::GLSL:
		return disassemble_spirv_glsl(module_create_info, entry_point, stage);

	case DisasmMethod::ISA:
		return disassemble_spirv_isa(device, pipeline, stage);

	default:
		return "";
	}
}